

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# data_table.cpp
# Opt level: O2

bool __thiscall
duckdb::DataTable::NextParallelScan
          (DataTable *this,ClientContext *context,ParallelTableScanState *state,
          TableScanState *scan_state)

{
  bool bVar1;
  RowGroupCollection *this_00;
  LocalStorage *this_01;
  
  this_00 = shared_ptr<duckdb::RowGroupCollection,_true>::operator->(&this->row_groups);
  bVar1 = RowGroupCollection::NextParallelScan
                    (this_00,context,&state->scan_state,&scan_state->table_state);
  if (bVar1) {
    return true;
  }
  this_01 = LocalStorage::Get(context,this->db);
  bVar1 = LocalStorage::NextParallelScan
                    (this_01,context,this,&state->local_state,&scan_state->local_state);
  return bVar1;
}

Assistant:

bool DataTable::NextParallelScan(ClientContext &context, ParallelTableScanState &state, TableScanState &scan_state) {
	if (row_groups->NextParallelScan(context, state.scan_state, scan_state.table_state)) {
		return true;
	}
	auto &local_storage = LocalStorage::Get(context, db);
	if (local_storage.NextParallelScan(context, *this, state.local_state, scan_state.local_state)) {
		return true;
	} else {
		// finished all scans: no more scans remaining
		return false;
	}
}